

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2DataBuilder::setOneWayMapping
          (Normalizer2DataBuilder *this,UChar32 c,UnicodeString *m)

{
  UBool UVar1;
  Norm *p;
  UnicodeString *this_00;
  undefined8 extraout_RAX;
  Norm *size;
  void *p_00;
  UMemory *unaff_R13;
  
  p_00 = (void *)(ulong)(uint)c;
  UVar1 = isWellFormed(m);
  if (UVar1 != '\0') {
    p = Norms::createNorm(&this->norms,c);
    size = p;
    checkNormForMapping(this,p,c);
    this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
    if (this_00 != (UnicodeString *)0x0) {
      UnicodeString::UnicodeString(this_00,m);
    }
    p->mapping = this_00;
    p->mappingType = ONE_WAY;
    Norm::setMappingCP(p);
    UnicodeSet::add(&(this->norms).mappingSet,c);
    return;
  }
  setOneWayMapping();
  UMemory::operator_delete(unaff_R13,p_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Normalizer2DataBuilder::setOneWayMapping(UChar32 c, const UnicodeString &m) {
    if(!isWellFormed(m)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal one-way mapping from U+%04lX to malformed string\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    Norm *p=checkNormForMapping(norms.createNorm(c), c);
    p->mapping=new UnicodeString(m);
    p->mappingType=Norm::ONE_WAY;
    p->setMappingCP();
    norms.mappingSet.add(c);
}